

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetPSTATToolInfo(ndicapi *pol,int port,char *information)

{
  int iVar1;
  char (*__src) [32];
  
  if (port - 0x31U < 3) {
    __src = pol->PstatBasic + (port - 0x31U);
  }
  else {
    if (8 < port - 0x41U) {
      return 3;
    }
    __src = pol->PstatPassiveBasic + (port - 0x41U);
  }
  iVar1 = 3;
  if (((*__src)[0] != '\0') && ((*__src)[0] != 'U')) {
    strncpy(information,*__src,0x1e);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

ndicapiExport int ndiGetPSTATToolInfo(ndicapi* pol, int port, char information[30])
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->PstatBasic[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->PstatPassiveBasic[port - 'A'];
  }
  else
  {
    return NDI_UNOCCUPIED;
  }

  // the 'U' is for UNOCCUPIED
  if (*dp == 'U' || *dp == '\0')
  {
    return NDI_UNOCCUPIED;
  }

  strncpy(information, dp, 30);

  return NDI_OKAY;
}